

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetColumnOffset(int column_index,float offset)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiColumnsSet *pIVar4;
  ImGuiColumnData *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *g;
  ImGuiColumnsSet *columns;
  int iVar8;
  ImGuiColumnData *pIVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar7 = GImGui;
  pIVar4 = (GImGui->CurrentWindow->DC).ColumnsSet;
  uVar3 = pIVar4->Flags;
  fVar1 = pIVar4->MinX;
  fVar2 = pIVar4->MaxX;
  fVar11 = fVar2 - fVar1;
  pIVar5 = (pIVar4->Columns).Data;
  while( true ) {
    if (column_index < 0) {
      column_index = pIVar4->Current;
    }
    fVar12 = 0.0;
    if (((uVar3 & 4) == 0) && (column_index < pIVar4->Count + -1)) {
      iVar8 = column_index;
      if (column_index < 0) {
        iVar8 = pIVar4->Current;
      }
      pIVar9 = (ImGuiColumnData *)&pIVar5[iVar8].OffsetNormBeforeResize;
      if (pIVar4->IsBeingResized == false) {
        pIVar9 = pIVar5 + iVar8;
      }
      fVar12 = ((&(pIVar5 + iVar8)[1].OffsetNorm)[pIVar4->IsBeingResized] - pIVar9->OffsetNorm) *
               fVar11;
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
    if (((uVar3 & 8) == 0) &&
       (fVar13 = fVar2 - (float)(pIVar4->Count - column_index) * (pIVar7->Style).ColumnsMinSpacing,
       fVar13 <= offset)) {
      offset = fVar13;
    }
    pIVar5[column_index].OffsetNorm = (offset - fVar1) / fVar11;
    if (!bVar6) break;
    column_index = column_index + 1;
    fVar13 = (pIVar7->Style).ColumnsMinSpacing;
    uVar10 = -(uint)(fVar12 <= fVar13);
    offset = offset + (float)(~uVar10 & (uint)fVar12 | (uint)fVar13 & uVar10);
  }
  return;
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < columns->Count-1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->MaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = PixelsToOffsetNorm(columns, offset - columns->MinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}